

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O2

QString * __thiscall
QWidgetLineControl::maskString
          (QString *__return_storage_ptr__,QWidgetLineControl *this,int pos,QString *str,bool clear)

{
  QWidgetLineControl *this_00;
  char16_t cVar1;
  QChar key;
  undefined2 mask;
  bool bVar2;
  int iVar3;
  uint uVar4;
  storage_type *psVar5;
  type pMVar6;
  uint uVar7;
  size_t __i;
  QChar QVar8;
  wchar32 wVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  QStringView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pos < *(int *)(this + 0x60)) {
    local_58.d = (Data *)0x0;
    local_58.ptr = (char16_t *)0x0;
    local_58.size = 0;
    if (clear) {
      clearString((QString *)&local_70,this,0,*(int *)(this + 0x60));
    }
    else {
      local_70.d = *(Data **)(this + 0x18);
      local_70.ptr = *(char16_t **)(this + 0x20);
      local_70.size = *(qsizetype *)(this + 0x28);
      if (local_70.d != (Data *)0x0) {
        LOCK();
        ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_70.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    QString::operator=((QString *)&local_58,(QString *)&local_70);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    psVar5 = (storage_type *)QByteArrayView::lengthHelperCharArray("",1);
    QVar13.m_data = psVar5;
    QVar13.m_size = (qsizetype)__return_storage_ptr__;
    QString::fromLatin1(QVar13);
    this_00 = this + 0xe8;
    for (uVar4 = 0;
        (pos < *(int *)(this + 0x60) && (uVar10 = (ulong)uVar4, uVar10 < (ulong)(str->d).size));
        uVar4 = uVar4 + uVar7) {
      __i = (size_t)pos;
      pMVar6 = std::
               unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
               ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                             *)this_00,__i);
      QVar8.ucs = (char16_t)__return_storage_ptr__;
      if (pMVar6->separator == true) {
        std::
        unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
        ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                      *)this_00,__i);
        QString::append(QVar8);
        cVar1 = (str->d).ptr[uVar10];
        pMVar6 = std::
                 unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                 ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                               *)this_00,__i);
        uVar7 = (uint)(cVar1 == (pMVar6->maskChar).ucs);
        pos = pos + 1;
      }
      else {
        key.ucs = (str->d).ptr[uVar10];
        pMVar6 = std::
                 unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                 ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                               *)this_00,__i);
        mask = pMVar6->maskChar;
        bVar2 = isValidInput(this,key,(QChar)mask);
        if (bVar2) {
          pMVar6 = std::
                   unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                   ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                                 *)this_00,__i);
          wVar9 = (wchar32)(ushort)(str->d).ptr[uVar10];
          if (pMVar6->caseMode == Lower) {
            QChar::toLower(wVar9);
          }
          else if (pMVar6->caseMode == Upper) {
            QChar::toUpper(wVar9);
          }
          QString::append(QVar8);
          pos = pos + 1;
        }
        else {
          iVar3 = findInMask(this,pos,true,true,(QChar)(str->d).ptr[uVar10]);
          if (iVar3 != -1) {
            if ((pos == 0) || ((str->d).size != 1)) {
LAB_003f7494:
              local_70.d = (Data *)local_58.size;
              local_70.ptr = local_58.ptr;
              QVar11 = QStringView::mid((QStringView *)&local_70,__i,(long)((iVar3 - pos) + 1));
              QString::append((QChar *)__return_storage_ptr__,(longlong)QVar11.m_data);
              pos = iVar3 + 1;
            }
            else if (0 < pos) {
              pMVar6 = std::
                       unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                       ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                                     *)this_00,(ulong)(pos - 1));
              if ((pMVar6->separator != true) ||
                 (pMVar6 = std::
                           unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                           ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                                         *)this_00,(ulong)(pos - 1)),
                 (pMVar6->maskChar).ucs != (str->d).ptr[uVar10])) goto LAB_003f7494;
            }
            uVar7 = 1;
            goto LAB_003f759f;
          }
          iVar3 = findInMask(this,pos,true,false,(QChar)(str->d).ptr[uVar10]);
          if (iVar3 != -1) {
            local_70.d = (Data *)local_58.size;
            local_70.ptr = local_58.ptr;
            QVar11 = QStringView::mid((QStringView *)&local_70,__i,(long)(iVar3 - pos));
            QString::append((QChar *)__return_storage_ptr__,(longlong)QVar11.m_data);
            pMVar6 = std::
                     unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                     ::operator[]((unique_ptr<QWidgetLineControl::MaskInputData[],_std::default_delete<QWidgetLineControl::MaskInputData[]>_>
                                   *)this_00,(long)iVar3);
            wVar9 = (wchar32)(ushort)(str->d).ptr[uVar10];
            if (pMVar6->caseMode == Lower) {
              QChar::toLower(wVar9);
            }
            else if (pMVar6->caseMode == Upper) {
              QChar::toUpper(wVar9);
            }
            QString::append(QVar8);
            pos = iVar3 + 1;
          }
        }
        uVar7 = 1;
      }
LAB_003f759f:
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
LAB_003f760c:
      __stack_chk_fail();
    }
  }
  else {
    psVar5 = (storage_type *)QByteArrayView::lengthHelperCharArray("",1);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_38) goto LAB_003f760c;
    QVar12.m_data = psVar5;
    QVar12.m_size = (qsizetype)__return_storage_ptr__;
    QString::fromLatin1(QVar12);
  }
  return __return_storage_ptr__;
}

Assistant:

QString QWidgetLineControl::maskString(int pos, const QString &str, bool clear) const
{
    if (pos >= m_maxLength)
        return QString::fromLatin1("");

    QString fill;
    fill = clear ? clearString(0, m_maxLength) : m_text;

    int strIndex = 0;
    QString s = QString::fromLatin1("");
    int i = pos;
    while (i < m_maxLength) {
        if (strIndex < str.size()) {
            if (m_maskData[i].separator) {
                s += m_maskData[i].maskChar;
                if (str[strIndex] == m_maskData[i].maskChar)
                    strIndex++;
                ++i;
            } else {
                if (isValidInput(str[strIndex], m_maskData[i].maskChar)) {
                    switch (m_maskData[i].caseMode) {
                    case MaskInputData::Upper:
                        s += str[strIndex].toUpper();
                        break;
                    case MaskInputData::Lower:
                        s += str[strIndex].toLower();
                        break;
                    default:
                        s += str[strIndex];
                    }
                    ++i;
                } else {
                    // search for separator first
                    int n = findInMask(i, true, true, str[strIndex]);
                    if (n != -1) {
                        if (str.size() != 1 || i == 0 || (i > 0 && (!m_maskData[i-1].separator || m_maskData[i-1].maskChar != str[strIndex]))) {
                            s += QStringView{fill}.mid(i, n - i + 1);
                            i = n + 1; // update i to find + 1
                        }
                    } else {
                        // search for valid m_blank if not
                        n = findInMask(i, true, false, str[strIndex]);
                        if (n != -1) {
                            s += QStringView{fill}.mid(i, n - i);
                            switch (m_maskData[n].caseMode) {
                            case MaskInputData::Upper:
                                s += str[strIndex].toUpper();
                                break;
                            case MaskInputData::Lower:
                                s += str[strIndex].toLower();
                                break;
                            default:
                                s += str[strIndex];
                            }
                            i = n + 1; // updates i to find + 1
                        }
                    }
                }
                ++strIndex;
            }
        } else
            break;
    }

    return s;
}